

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

bool re2::TopEqual(Regexp *a,Regexp *b)

{
  uint8_t uVar1;
  uint8_t uVar2;
  CharClass *pCVar3;
  CharClass *pCVar4;
  bool bVar5;
  int iVar6;
  size_t __n;
  void *__s2;
  void *__s1;
  LogMessage local_190;
  
  uVar1 = a->op_;
  uVar2 = b->op_;
  if (uVar1 == uVar2) {
    bVar5 = true;
    switch(uVar1) {
    case '\x01':
    case '\x02':
    case '\f':
    case '\r':
    case '\x0e':
    case '\x0f':
    case '\x10':
    case '\x11':
    case '\x12':
      goto switchD_0024472e_caseD_1;
    case '\x03':
      if (uVar2 != '\x03') {
        __assert_fail("(op_) == (kRegexpLiteral)",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/regexp.h"
                      ,0x152,"Rune re2::Regexp::rune()");
      }
      if ((a->field_7).field_0.max_ == (b->field_7).field_0.max_) {
        return ((b->parse_flags_ ^ a->parse_flags_) & 1) == 0;
      }
      break;
    case '\x04':
      if (uVar2 != '\x04') {
        __assert_fail("(op_) == (kRegexpLiteralString)",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/regexp.h"
                      ,0x157,"int re2::Regexp::nrunes()");
      }
      iVar6 = (a->field_7).field_0.max_;
      if ((iVar6 == (b->field_7).field_0.max_) && (((b->parse_flags_ ^ a->parse_flags_) & 1) == 0))
      {
        __s1 = (a->field_7).the_union_[1];
        __s2 = (b->field_7).the_union_[1];
        __n = (long)iVar6 << 2;
LAB_00244813:
        iVar6 = bcmp(__s1,__s2,__n);
        return iVar6 == 0;
      }
      break;
    case '\x05':
    case '\x06':
      return a->nsub_ == b->nsub_;
    case '\a':
    case '\b':
    case '\t':
      return ((b->parse_flags_ ^ a->parse_flags_) & 0x40) == 0;
    case '\n':
      if (((b->parse_flags_ ^ a->parse_flags_) & 0x40) == 0) {
        if ((uVar1 != '\n') || (uVar2 != '\n')) {
          __assert_fail("(op_) == (kRegexpRepeat)",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/regexp.h"
                        ,0x150,"int re2::Regexp::min()");
        }
        if ((a->field_7).field_0.min_ == (b->field_7).field_0.min_) goto LAB_002447cc;
      }
      break;
    case '\v':
      if (uVar2 != '\v') {
        __assert_fail("(op_) == (kRegexpCapture)",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/regexp.h"
                      ,0x154,"int re2::Regexp::cap()");
      }
      if ((a->field_7).field_0.max_ == (b->field_7).field_0.max_) {
        return (a->field_7).field_1.name_ == (b->field_7).field_1.name_;
      }
      break;
    case '\x13':
      return ((b->parse_flags_ ^ a->parse_flags_) >> 0xd & 1) == 0;
    case '\x14':
      if (uVar2 != '\x14') {
        __assert_fail("(op_) == (kRegexpCharClass)",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/regexp.h"
                      ,0x153,"CharClass *re2::Regexp::cc()");
      }
      pCVar3 = (a->field_7).field_3.cc_;
      pCVar4 = (b->field_7).field_3.cc_;
      if ((*(int *)(pCVar3 + 4) == *(int *)(pCVar4 + 4)) &&
         (*(int *)(pCVar3 + 0x10) == *(int *)(pCVar4 + 0x10))) {
        __n = (long)*(int *)(pCVar3 + 0x10) << 3;
        __s2 = *(void **)(pCVar4 + 8);
        __s1 = *(void **)(pCVar3 + 8);
        goto LAB_00244813;
      }
      break;
    case '\x15':
      if (uVar2 != '\x15') {
        __assert_fail("(op_) == (kRegexpHaveMatch)",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/regexp.h"
                      ,0x158,"int re2::Regexp::match_id()");
      }
LAB_002447cc:
      return (a->field_7).field_0.max_ == (b->field_7).field_0.max_;
    default:
      LogMessage::LogMessage
                (&local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/regexp.cc"
                 ,0x1a2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_190.str_,"Unexpected op in Regexp::Equal: ",0x20);
      std::ostream::operator<<(&local_190.str_,(uint)a->op_);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
    }
  }
  bVar5 = false;
switchD_0024472e_caseD_1:
  return bVar5;
}

Assistant:

Regexp* Regexp::NewLiteral(Rune rune, ParseFlags flags) {
  Regexp* re = new Regexp(kRegexpLiteral, flags);
  re->rune_ = rune;
  return re;
}